

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O0

StackSym * StackSym::New(SymID id,IRType type,RegSlot byteCodeRegSlot,Func *func)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  ByteCodeStackSym *pBVar5;
  Sym *pSVar6;
  undefined4 *puVar7;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  ByteCodeStackSym *local_28;
  StackSym *stackSym;
  Func *func_local;
  IRType local_d;
  RegSlot byteCodeRegSlot_local;
  IRType type_local;
  SymID id_local;
  
  stackSym = (StackSym *)func;
  func_local._4_4_ = byteCodeRegSlot;
  local_d = type;
  byteCodeRegSlot_local = id;
  if (byteCodeRegSlot == 0xffffffff) {
    pJVar1 = func->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
               ,0x1e);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar1,&local_88);
    pBVar5 = (ByteCodeStackSym *)new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3fb100)
    ;
    memset(pBVar5,0,0x50);
    StackSym((StackSym *)pBVar5);
    local_28 = pBVar5;
  }
  else {
    pJVar1 = func->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&ByteCodeStackSym::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
               ,0x19);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar1,&local_50);
    local_60 = Memory::ArenaAllocator::AllocZero;
    local_58 = 0;
    pBVar5 = (ByteCodeStackSym *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar4,0x3fb100)
    ;
    ByteCodeStackSym::ByteCodeStackSym(pBVar5,func_local._4_4_,(Func *)stackSym);
    *(uint *)&(pBVar5->super_StackSym).field_0x18 =
         *(uint *)&(pBVar5->super_StackSym).field_0x18 & 0xffffdfff | 0x2000;
    local_28 = pBVar5;
  }
  (local_28->super_StackSym).super_Sym.m_id = byteCodeRegSlot_local;
  (local_28->super_StackSym).super_Sym.m_kind = SymKindStack;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xfffffff7;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xffffffef;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xffffffdf;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xfffffffe | 1;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xffffffbf;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xfffffeff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xffffff7f;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xfffffbff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xfffff7ff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xffffefff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xfffeffff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xffefffff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xffdfffff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xfbffffff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xffbfffff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xff7fffff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xfeffffff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xfdffffff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xfffdffff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xf7ffffff;
  *(uint *)&(local_28->super_StackSym).field_0x18 =
       *(uint *)&(local_28->super_StackSym).field_0x18 & 0xefffffff;
  Js::BuiltinFunction::operator=(&(local_28->super_StackSym).m_builtInIndex,None);
  *(undefined2 *)&(local_28->super_StackSym).super_Sym.field_0x16 = 0xffff;
  (local_28->super_StackSym).m_type = local_d;
  (local_28->super_StackSym).m_equivNext = &local_28->super_StackSym;
  (local_28->super_StackSym).m_objectInfo = (ObjectSymInfo *)0x0;
  pSVar6 = SymTable::Find((SymTable *)stackSym[5].field_5.m_instrDef,byteCodeRegSlot_local);
  if (pSVar6 != (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x42,"(func->m_symTable->Find(id) == nullptr)",
                       "Trying to add new symbol which already exists.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  SymTable::Add((SymTable *)stackSym[5].field_5.m_instrDef,(Sym *)local_28);
  return &local_28->super_StackSym;
}

Assistant:

StackSym *
StackSym::New(SymID id, IRType type, Js::RegSlot byteCodeRegSlot, Func *func)
{
    StackSym * stackSym;

    if (byteCodeRegSlot != Js::Constants::NoRegister)
    {
        stackSym = AnewZ(func->m_alloc, ByteCodeStackSym, byteCodeRegSlot, func);
        stackSym->m_hasByteCodeRegSlot = true;
    }
    else
    {
        stackSym = AnewZ(func->m_alloc, StackSym);
    }

    stackSym->m_id = id;
    stackSym->m_kind = SymKindStack;

    // Assume SingleDef until proven false.

    stackSym->m_isConst = false;
    stackSym->m_isIntConst = false;
    stackSym->m_isTaggableIntConst = false;
    stackSym->m_isSingleDef = true;
    stackSym->m_isEncodedConstant = false;
    stackSym->m_isFltConst = false;
    stackSym->m_isInt64Const = false;
    stackSym->m_isStrConst = false;
    stackSym->m_isStrEmpty = false;
    stackSym->m_allocated = false;
    stackSym->m_isTypeSpec = false;
    stackSym->m_isArgSlotSym = false;
    stackSym->m_isArgSlotRegSym = false;
    stackSym->m_nonEscapingArgObjAlias = false;
    stackSym->m_isParamSym = false;
    stackSym->m_isImplicitParamSym = false;
    stackSym->m_isBailOutReferenced = false;
    stackSym->m_isArgCaptured = false;
    stackSym->m_requiresBailOnNotNumber = false;
    stackSym->m_isCatchObjectSym = false;
    stackSym->m_isClosureSym = false;
    stackSym->m_builtInIndex = Js::BuiltinFunction::None;
    stackSym->m_slotNum = StackSym::InvalidSlot;

    stackSym->m_type = type;
    stackSym->m_equivNext = stackSym;
    stackSym->m_objectInfo = nullptr;

    AssertMsg(func->m_symTable->Find(id) == nullptr, "Trying to add new symbol which already exists.");
    func->m_symTable->Add(stackSym);

    return stackSym;
}